

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.cc
# Opt level: O0

int __thiscall Buffer::copy(Buffer *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  uchar *__dest;
  uchar *__src;
  Members *this_00;
  pointer pMVar1;
  unique_ptr<Buffer::Members,_std::default_delete<Buffer::Members>_> local_20;
  EVP_PKEY_CTX *local_18;
  Buffer *rhs_local;
  Buffer *this_local;
  
  pMVar1 = (pointer)this;
  if ((EVP_PKEY_CTX *)this != dst) {
    local_18 = dst;
    rhs_local = this;
    this_00 = (Members *)operator_new(0x38);
    pMVar1 = std::unique_ptr<Buffer::Members,_std::default_delete<Buffer::Members>_>::operator->
                       ((unique_ptr<Buffer::Members,_std::default_delete<Buffer::Members>_> *)
                        local_18);
    Members::Members(this_00,pMVar1->size,(uchar *)0x0,true);
    std::unique_ptr<Buffer::Members,std::default_delete<Buffer::Members>>::
    unique_ptr<std::default_delete<Buffer::Members>,void>
              ((unique_ptr<Buffer::Members,std::default_delete<Buffer::Members>> *)&local_20,this_00
              );
    std::unique_ptr<Buffer::Members,_std::default_delete<Buffer::Members>_>::operator=
              (&this->m,&local_20);
    std::unique_ptr<Buffer::Members,_std::default_delete<Buffer::Members>_>::~unique_ptr(&local_20);
    pMVar1 = std::unique_ptr<Buffer::Members,_std::default_delete<Buffer::Members>_>::operator->
                       (&this->m);
    if (pMVar1->size != 0) {
      pMVar1 = std::unique_ptr<Buffer::Members,_std::default_delete<Buffer::Members>_>::operator->
                         (&this->m);
      __dest = pMVar1->buf;
      pMVar1 = std::unique_ptr<Buffer::Members,_std::default_delete<Buffer::Members>_>::operator->
                         ((unique_ptr<Buffer::Members,_std::default_delete<Buffer::Members>_> *)
                          local_18);
      __src = pMVar1->buf;
      pMVar1 = std::unique_ptr<Buffer::Members,_std::default_delete<Buffer::Members>_>::operator->
                         (&this->m);
      pMVar1 = (pointer)memcpy(__dest,__src,pMVar1->size);
    }
  }
  return (int)pMVar1;
}

Assistant:

void
Buffer::copy(Buffer const& rhs)
{
    if (this != &rhs) {
        m = std::unique_ptr<Members>(new Members(rhs.m->size, nullptr, true));
        if (m->size) {
            memcpy(m->buf, rhs.m->buf, m->size);
        }
    }
}